

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool __thiscall
bssl::ECHServerConfig::SetupContext
          (ECHServerConfig *this,EVP_HPKE_CTX *ctx,uint16_t kdf_id,uint16_t aead_id,
          Span<const_unsigned_char> enc)

{
  ECHServerConfig *pEVar1;
  uint16_t uVar2;
  int iVar3;
  EVP_HPKE_AEAD *pEVar4;
  EVP_HPKE_KDF *kdf;
  uint8_t *info;
  size_t info_len;
  char cVar5;
  long lVar6;
  bool bVar7;
  uint16_t supported_aead_id;
  EVP_HPKE_CTX *local_90;
  uchar *local_88;
  size_t local_80;
  ECHServerConfig *local_78;
  ScopedCBB info_cbb;
  CBS cbs;
  
  local_80 = enc.size_;
  local_88 = enc.data_;
  cbs.data = (this->ech_config_).cipher_suites.data_;
  cbs.len = (this->ech_config_).cipher_suites.size_;
  bVar7 = false;
  local_90 = ctx;
  local_78 = this;
  do {
    if (cbs.len == 0) goto LAB_001368d6;
    iVar3 = CBS_get_u16(&cbs,(uint16_t *)&info_cbb);
    cVar5 = '\x01';
    if (((iVar3 != 0) && (iVar3 = CBS_get_u16(&cbs,&supported_aead_id), iVar3 != 0)) &&
       (cVar5 = (supported_aead_id == aead_id && (uint16_t)info_cbb.ctx_.child == kdf_id) * '\x03',
       supported_aead_id == aead_id && (uint16_t)info_cbb.ctx_.child == kdf_id)) {
      bVar7 = true;
    }
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_001368d6:
    if (bVar7) {
      CBB_zero(&info_cbb.ctx_);
      pEVar1 = local_78;
      iVar3 = CBB_init(&info_cbb.ctx_,(local_78->ech_config_).raw.size_ + 8);
      if (((iVar3 == 0) || (iVar3 = CBB_add_bytes(&info_cbb.ctx_,"tls ech",8), iVar3 == 0)) ||
         (iVar3 = CBB_add_bytes(&info_cbb.ctx_,(pEVar1->ech_config_).raw.data_,
                                (pEVar1->ech_config_).raw.size_), iVar3 == 0)) {
        bVar7 = false;
      }
      else {
        if (kdf_id != 1) {
          __assert_fail("kdf_id == EVP_HPKE_HKDF_SHA256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0x24a,
                        "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                       );
        }
        lVar6 = 0;
        do {
          pEVar4 = (EVP_HPKE_AEAD *)(**(code **)((long)&kSupportedAEADs + lVar6))();
          uVar2 = EVP_HPKE_AEAD_id(pEVar4);
          if (uVar2 == aead_id) goto LAB_0013697d;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x18);
        pEVar4 = (EVP_HPKE_AEAD *)0x0;
LAB_0013697d:
        if (pEVar4 == (EVP_HPKE_AEAD *)0x0) {
          __assert_fail("get_ech_aead(aead_id) != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0x24b,
                        "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                       );
        }
        kdf = EVP_hpke_hkdf_sha256();
        lVar6 = 0;
        do {
          pEVar4 = (EVP_HPKE_AEAD *)(**(code **)((long)&kSupportedAEADs + lVar6))();
          uVar2 = EVP_HPKE_AEAD_id(pEVar4);
          if (uVar2 == aead_id) goto LAB_001369ba;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x18);
        pEVar4 = (EVP_HPKE_AEAD *)0x0;
LAB_001369ba:
        info = CBB_data(&info_cbb.ctx_);
        info_len = CBB_len(&info_cbb.ctx_);
        iVar3 = EVP_HPKE_CTX_setup_recipient
                          (local_90,&(pEVar1->key_).ctx_,kdf,pEVar4,local_88,local_80,info,info_len)
        ;
        bVar7 = iVar3 != 0;
      }
      CBB_cleanup(&info_cbb.ctx_);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool ECHServerConfig::SetupContext(EVP_HPKE_CTX *ctx, uint16_t kdf_id,
                                   uint16_t aead_id,
                                   Span<const uint8_t> enc) const {
  // Check the cipher suite is supported by this ECHServerConfig.
  CBS cbs(ech_config_.cipher_suites);
  bool cipher_ok = false;
  while (CBS_len(&cbs) != 0) {
    uint16_t supported_kdf_id, supported_aead_id;
    if (!CBS_get_u16(&cbs, &supported_kdf_id) ||
        !CBS_get_u16(&cbs, &supported_aead_id)) {
      return false;
    }
    if (kdf_id == supported_kdf_id && aead_id == supported_aead_id) {
      cipher_ok = true;
      break;
    }
  }
  if (!cipher_ok) {
    return false;
  }

  static const uint8_t kInfoLabel[] = "tls ech";
  ScopedCBB info_cbb;
  if (!CBB_init(info_cbb.get(), sizeof(kInfoLabel) + ech_config_.raw.size()) ||
      !CBB_add_bytes(info_cbb.get(), kInfoLabel,
                     sizeof(kInfoLabel) /* includes trailing NUL */) ||
      !CBB_add_bytes(info_cbb.get(), ech_config_.raw.data(),
                     ech_config_.raw.size())) {
    return false;
  }

  assert(kdf_id == EVP_HPKE_HKDF_SHA256);
  assert(get_ech_aead(aead_id) != NULL);
  return EVP_HPKE_CTX_setup_recipient(ctx, key_.get(), EVP_hpke_hkdf_sha256(),
                                      get_ech_aead(aead_id), enc.data(),
                                      enc.size(), CBB_data(info_cbb.get()),
                                      CBB_len(info_cbb.get()));
}